

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ExplicitAnsiPortSyntax::getChild(ExplicitAnsiPortSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  undefined8 in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff68;
  TokenOrSyntax *in_stack_ffffffffffffff70;
  nullptr_t in_stack_ffffffffffffff78;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x18),in_stack_ffffffffffffff68);
    break;
  case 1:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token);
    break;
  case 2:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token_00);
    break;
  case 3:
    token_01.info = in_RDI;
    token_01._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token_01);
    break;
  case 4:
    token_02.info = in_RDI;
    token_02._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token_02);
    break;
  case 5:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 6:
    token_03.info = in_RDI;
    token_03._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token_03);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffff78);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax ExplicitAnsiPortSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return direction;
        case 2: return dot;
        case 3: return name;
        case 4: return openParen;
        case 5: return expr;
        case 6: return closeParen;
        default: return nullptr;
    }
}